

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_statics.cpp
# Opt level: O0

ON_ModelComponentTypeIterator *
Internal_ON_ModelComponentIterator_Init
          (ON_ModelComponentTypeIterator *__return_storage_ptr__,int list_selector)

{
  Type local_30 [8];
  Type table_types [9];
  Type explicit_types [13];
  int list_selector_local;
  
  stack0xffffffffffffffe0 = 0x504030201;
  local_30[0] = TextureMapping;
  local_30[1] = Material;
  local_30[2] = LinePattern;
  local_30[3] = Layer;
  local_30[4] = Group;
  local_30[5] = TextStyle;
  local_30[6] = DimStyle;
  local_30[7] = HatchPattern;
  table_types[0] = InstanceDefinition;
  if (list_selector == 1) {
    ON_ModelComponentTypeIterator::ON_ModelComponentTypeIterator
              (__return_storage_ptr__,0xd,table_types + 8);
  }
  else if (list_selector == 2) {
    ON_ModelComponentTypeIterator::ON_ModelComponentTypeIterator(__return_storage_ptr__,9,local_30);
  }
  else {
    ON_ModelComponentTypeIterator::ON_ModelComponentTypeIterator
              (__return_storage_ptr__,0,(Type *)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

static const ON_ModelComponentTypeIterator Internal_ON_ModelComponentIterator_Init(
  int list_selector
  )
{
  //const ON_ModelComponent::Type all_types[] =
  //{
  //  ON_ModelComponent::Type::Unset,
  //  ON_ModelComponent::Type::Image,
  //  ON_ModelComponent::Type::TextureMapping,
  //  ON_ModelComponent::Type::RenderMaterial,
  //  ON_ModelComponent::Type::LinePattern,
  //  ON_ModelComponent::Type::Layer,
  //  ON_ModelComponent::Type::Group,
  //  ON_ModelComponent::Type::TextStyle,
  //  ON_ModelComponent::Type::DimStyle,
  //  ON_ModelComponent::Type::RenderLight,
  //  ON_ModelComponent::Type::HatchPattern,
  //  ON_ModelComponent::Type::InstanceDefinition,
  //  ON_ModelComponent::Type::ModelGeometry,
  //  ON_ModelComponent::Type::HistoryRecord,
  //  ON_ModelComponent::Type::Mixed,
  //};

  const ON_ModelComponent::Type explicit_types[] =
  {
    //ALWAYS EXCLUDE// ON_ModelComponent::Type::Unset,
    ON_ModelComponent::Type::Image,
    ON_ModelComponent::Type::TextureMapping,
    ON_ModelComponent::Type::RenderMaterial,
    ON_ModelComponent::Type::LinePattern,
    ON_ModelComponent::Type::Layer,
    ON_ModelComponent::Type::Group,
    ON_ModelComponent::Type::TextStyle,
    ON_ModelComponent::Type::DimStyle,
    ON_ModelComponent::Type::RenderLight,
    ON_ModelComponent::Type::HatchPattern,
    ON_ModelComponent::Type::InstanceDefinition,
    ON_ModelComponent::Type::ModelGeometry,
    ON_ModelComponent::Type::HistoryRecord,
    //ALWAYS EXCLUDE// ON_ModelComponent::Type::Mixed,
  };

  const ON_ModelComponent::Type table_types[] =
  {
    //ALWAYS EXCLUDE// ON_ModelComponent::Type::Unset,
    //ON_ModelComponent::Type::Image,
    ON_ModelComponent::Type::TextureMapping,
    ON_ModelComponent::Type::RenderMaterial,
    ON_ModelComponent::Type::LinePattern,
    ON_ModelComponent::Type::Layer,
    ON_ModelComponent::Type::Group,
    ON_ModelComponent::Type::TextStyle,
    ON_ModelComponent::Type::DimStyle,
    //ON_ModelComponent::Type::RenderLight,
    ON_ModelComponent::Type::HatchPattern,
    ON_ModelComponent::Type::InstanceDefinition,
    //ON_ModelComponent::Type::ModelGeometry,
    //ON_ModelComponent::Type::HistoryRecord,
    //ALWAYS EXCLUDE// ON_ModelComponent::Type::Mixed,
  };

  switch (list_selector)
  {
    //case 0:
    //  return ON_ModelComponentTypeIterator(sizeof(all_types) / sizeof(all_types[0]), all_types);
  case 1:
    return ON_ModelComponentTypeIterator(sizeof(explicit_types) / sizeof(explicit_types[0]), explicit_types);
  case 2:
    return ON_ModelComponentTypeIterator(sizeof(table_types) / sizeof(table_types[0]), table_types);
  }

  return ON_ModelComponentTypeIterator(0, nullptr);
}